

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O0

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,void *storage,uint32_t capacity)

{
  uint32_t capacity_local;
  void *storage_local;
  gc_heap *this_local;
  
  pointer_set::pointer_set(&this->pointers_);
  allocation_context::allocation_context(&this->alloc_context_,storage,capacity);
  this->owns_storage_ = false;
  gc_state::gc_state(&this->gc_state_);
  return;
}

Assistant:

gc_heap::gc_heap(void* storage, uint32_t capacity) : alloc_context_(storage, capacity), owns_storage_(false) {
}